

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpki-rov.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  long in_FS_OFFSET;
  uint local_330;
  uint local_32c;
  uint i;
  int validity_code;
  char *input_tok;
  int spaces;
  int input_len;
  int counter;
  int sleep_counter;
  char **argv_local;
  int argc_local;
  long lStack_2f8;
  uint reason_len;
  pfx_record *reason;
  uint local_2e8;
  pfxv_state result;
  int asn;
  int mask;
  rtr_mgr_config *conf;
  rtr_socket rtr_tcp;
  tr_tcp_config tcp_config;
  tr_socket tr_tcp;
  undefined1 local_1e8 [6];
  char delims [2];
  char tmp [100];
  char local_178 [8];
  char ip [46];
  undefined1 local_13c [8];
  lrtr_ip_addr pref;
  char input [256];
  rtr_mgr_group groups [1];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (argc < 3) {
    printf("Usage: %s [host] [port]\n",*argv);
  }
  else {
    rtr_tcp._120_8_ = argv[1];
    tcp_config.host = argv[2];
    tcp_config.port = (char *)0x0;
    tcp_config.bindaddr = (char *)0x0;
    tcp_config.data = (void *)0x0;
    tcp_config.new_socket._0_4_ = 0;
    tr_tcp_init(&rtr_tcp.is_resetting,&tcp_config.connect_timeout);
    conf = (rtr_mgr_config *)&tcp_config.connect_timeout;
    input._248_8_ = malloc(8);
    *(rtr_mgr_config ***)input._248_8_ = &conf;
    iVar3 = rtr_mgr_init(&asn,input + 0xf8,1,connection_status_callback,0);
    if (-1 < iVar3) {
      iVar3 = rtr_mgr_add_roa_support(_asn,0);
      if (iVar3 == -1) {
        fprintf(_stderr,"Failed initializing ROA support\n");
      }
      iVar3 = rtr_mgr_add_aspa_support(_asn,0);
      if (iVar3 == -1) {
        fprintf(_stderr,"Failed initializing ASPA support\n");
      }
      iVar3 = rtr_mgr_add_spki_support(_asn,0);
      if (iVar3 == -1) {
        fprintf(_stderr,"Failed initializing BGPSEC support\n");
      }
      rtr_mgr_setup_sockets(_asn,input + 0xf8,1,0x32,600);
      rtr_mgr_start(_asn);
      input_len = 0;
      do {
        bVar2 = rtr_mgr_conf_in_sync(_asn);
        if (((bVar2 ^ 0xff) & 1) == 0) goto LAB_00101549;
        iVar3 = connection_error(connection_status);
        if (iVar3 != 0) goto LAB_001019e2;
        sleep(1);
        input_len = input_len + 1;
      } while (input_len < 0x14);
      fgets((char *)(pref.u.addr6.addr + 2),0x100,_stdin);
      printf("timeout\n");
      fflush(_stdout);
    }
  }
  goto LAB_001019e2;
LAB_00101549:
  iVar3 = connection_error(connection_status);
  if (iVar3 == 0) {
    pcVar4 = fgets((char *)(pref.u.addr6.addr + 2),0x100,_stdin);
    if (pcVar4 == (char *)0x0) {
      printf("input error\n");
      goto LAB_001019e2;
    }
    sVar5 = strlen((char *)(pref.u.addr6.addr + 2));
    iVar3 = (int)sVar5 + -1;
    if (input[(long)iVar3 + -8] == '\n') {
      input[(long)iVar3 + -8] = '\0';
    }
    input_tok._0_4_ = 0;
    for (spaces = 0; spaces < iVar3; spaces = spaces + 1) {
      if ((((input[(long)spaces + -8] == ' ') && (input[(long)(spaces + 1) + -8] != ' ')) &&
          (input[(long)(spaces + 1) + -8] != '\0')) && (spaces != 0)) {
        input_tok._0_4_ = (int)input_tok + 1;
      }
    }
    if ((int)input_tok == 2) {
      tr_tcp.ident_fp._6_2_ = 0x20;
      pcVar4 = strtok((char *)(pref.u.addr6.addr + 2),(char *)((long)&tr_tcp.ident_fp + 6));
      sVar5 = strlen(pcVar4);
      if (sVar5 < 0x2e) {
        memset(local_178,0,0x2e);
        strncpy(local_178,pcVar4,0x2d);
        iVar3 = lrtr_ip_str_to_addr(local_178,local_13c);
        if (iVar3 == 0) {
          pcVar4 = strtok((char *)0x0,(char *)((long)&tr_tcp.ident_fp + 6));
          iVar3 = str_to_int(pcVar4,(int *)&result);
          if (iVar3 == 0) {
            pcVar4 = strtok((char *)0x0,(char *)((long)&tr_tcp.ident_fp + 6));
            iVar3 = str_to_int(pcVar4,(int *)&local_2e8);
            if (iVar3 == 0) {
              lStack_2f8 = 0;
              argc_local = 0;
              pfx_table_validate_r
                        (*(undefined8 *)(*(long *)input._248_8_ + 0x38),&stack0xfffffffffffffd08,
                         &argc_local,local_2e8,local_13c,(char)result,(long)&reason + 4);
              local_32c = 0xffffffff;
              if (reason._4_4_ == 0) {
                local_32c = 0;
              }
              else if (reason._4_4_ == 1) {
                local_32c = 1;
              }
              else if (reason._4_4_ == 2) {
                local_32c = 2;
              }
              printf("%s %d %d|",local_178,(ulong)result,(ulong)local_2e8);
              if ((lStack_2f8 != 0) && (argc_local != 0)) {
                for (local_330 = 0; local_330 < (uint)argc_local; local_330 = local_330 + 1) {
                  lrtr_ip_addr_to_str(lStack_2f8 + (ulong)local_330 * 0x28 + 4,local_1e8,100);
                  printf("%u %s %u %u",(ulong)*(uint *)(lStack_2f8 + (ulong)local_330 * 0x28),
                         local_1e8,(ulong)*(byte *)(lStack_2f8 + (ulong)local_330 * 0x28 + 0x18),
                         (ulong)*(byte *)(lStack_2f8 + (ulong)local_330 * 0x28 + 0x19));
                  if (local_330 + 1 < (uint)argc_local) {
                    printf(",");
                  }
                }
              }
              printf("|%d",(ulong)local_32c);
              printf("\n");
              fflush(_stdout);
            }
            else {
              fprintf(_stderr,"Error: Invalid asn\n");
            }
          }
          else {
            fprintf(_stderr,"Error: Invalid mask\n");
          }
        }
        else {
          fprintf(_stderr,"Error: Invalid ip addr\n");
        }
      }
      else {
        fprintf(_stderr,"Error: Invalid ip addr\n");
      }
    }
    else {
      printf("Arguments required: IP Mask ASN\n");
      fflush(_stdout);
    }
    goto LAB_00101549;
  }
LAB_001019e2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 1;
  }
  __stack_chk_fail();
}

Assistant:

int main(int argc, char *argv[])
{
	/* check arguments, need hostname/IP and port of cache-server */
	if (argc < 3) {
		printf("Usage: %s [host] [port]\n", argv[0]);
		return EXIT_FAILURE;
	}

	struct tr_socket tr_tcp;
	struct tr_tcp_config tcp_config = {argv[1], argv[2], NULL, NULL, NULL, 0};
	struct rtr_socket rtr_tcp;
	struct rtr_mgr_config *conf;
	struct rtr_mgr_group groups[1];

	/* init a TCP transport and create rtr socket */
	tr_tcp_init(&tcp_config, &tr_tcp);
	rtr_tcp.tr_socket = &tr_tcp;

	/* create a rtr_mgr_group array with 1 element */
	groups[0].sockets = malloc(1 * sizeof(struct rtr_socket *));
	groups[0].sockets_len = 1;
	groups[0].sockets[0] = &rtr_tcp;
	groups[0].preference = 1;

	if (rtr_mgr_init(&conf, groups, 1, &connection_status_callback, NULL) < 0)
		return EXIT_FAILURE;

	if (rtr_mgr_add_roa_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing ROA support\n");
	}

	if (rtr_mgr_add_aspa_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing ASPA support\n");
	}

	if (rtr_mgr_add_spki_support(conf, NULL) == RTR_ERROR) {
		fprintf(stderr, "Failed initializing BGPSEC support\n");
	}

	rtr_mgr_setup_sockets(conf, groups, 1, 50, 600, 600);

	rtr_mgr_start(conf);

	char input[256];
	int sleep_counter = 0;

	/* wait till at least one rtr_mgr_group is synchronized with server */
	while (!rtr_mgr_conf_in_sync(conf)) {
		if (connection_error(connection_status))
			return EXIT_FAILURE;

		sleep(1);
		sleep_counter++;
		if (sleep_counter >= connection_timeout) {
			/*
			 * Wait for input before printing "timeout",
			 * to avoid "broken pipee error while communicating
			 * with the Python program
			 */
			if (fgets(input, 256, stdin))
				;
			printf("timeout\n");
			fflush(stdout);
			return EXIT_FAILURE;
		}
	}

	int counter;
	/* loop for input */
	while (1) {
		int input_len;
		int spaces;

		/* recheck connection, exit on failure */
		if (connection_error(connection_status))
			return EXIT_FAILURE;

		/* try reading from stdin, exit on failure */
		if (!fgets(input, 256, stdin)) {
			printf("input error\n");
			return EXIT_FAILURE;
		}

		/* remove newline, if present */
		input_len = strlen(input) - 1;
		if (input[input_len] == '\n')
			input[input_len] = '\0';

		/* check if there are exactly 3 arguments */
		spaces = 0;
		for (counter = 0; counter < input_len; counter++) {
			if (input[counter] == ' ' && input[counter + 1] != ' ' && input[counter + 1] != '\0' &&
			    counter != 0)
				spaces++;
		}

		/* check input matching pattern */
		if (spaces != 2) {
			printf("Arguments required: IP Mask ASN\n");
			fflush(stdout);
			continue;
		}

		char delims[] = " ";
		char *input_tok = NULL;

		input_tok = strtok(input, delims);
		struct lrtr_ip_addr pref;
		char ip[INET6_ADDRSTRLEN];

		if (strlen(input_tok) > sizeof(ip) - 1) {
			fprintf(stderr, "Error: Invalid ip addr\n");
			continue;
		}

		memset(ip, 0, sizeof(ip));
		strncpy(ip, input_tok, sizeof(ip) - 1);

		if (lrtr_ip_str_to_addr(ip, &pref) != 0) {
			fprintf(stderr, "Error: Invalid ip addr\n");
			continue;
		}

		input_tok = strtok(NULL, delims);
		int mask;

		if (str_to_int(input_tok, &mask)) {
			fprintf(stderr, "Error: Invalid mask\n");
			continue;
		}

		input_tok = strtok(NULL, delims);
		int asn;

		if (str_to_int(input_tok, &asn)) {
			fprintf(stderr, "Error: Invalid asn\n");
			continue;
		}

		enum pfxv_state result;
		struct pfx_record *reason = NULL;
		unsigned int reason_len = 0;

		/* do validation */
		pfx_table_validate_r(groups[0].sockets[0]->pfx_table, &reason, &reason_len, asn, &pref, mask, &result);

		int validity_code = -1;
		/* translate validation result */
		if (result == BGP_PFXV_STATE_VALID)
			validity_code = 0;
		else if (result == BGP_PFXV_STATE_NOT_FOUND)
			validity_code = 1;
		else if (result == BGP_PFXV_STATE_INVALID)
			validity_code = 2;

		/* IP Mask BGP-ASN| */
		printf("%s %d %d|", ip, mask, asn);

		/* ROA-ASN IP MaskMin MaskMax, ... */
		if (reason && (reason_len > 0)) {
			unsigned int i;

			for (i = 0; i < reason_len; i++) {
				char tmp[100];

				lrtr_ip_addr_to_str(&reason[i].prefix, tmp, sizeof(tmp));
				printf("%u %s %u %u", reason[i].asn, tmp, reason[i].min_len, reason[i].max_len);
				if ((i + 1) < reason_len)
					printf(",");
			}
		}

		/* |validity_code */
		printf("|%d", validity_code);

		printf("\n");
		fflush(stdout);
	}

	rtr_mgr_stop(conf);
	rtr_mgr_free(conf);
	free(groups[0].sockets);

	return EXIT_SUCCESS;
}